

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O3

void xLearn::RecallMetric::recall_accum_thread
               (vector<float,_std::allocator<float>_> *Y,vector<float,_std::allocator<float>_> *pred
               ,index_t *true_pos,index_t *false_neg,size_t start_idx,size_t end_idx)

{
  float fVar1;
  float fVar2;
  pointer pfVar3;
  pointer pfVar4;
  ostream *poVar5;
  size_t i;
  index_t *piVar6;
  Logger local_6c;
  string local_68;
  string local_48;
  
  if (start_idx <= end_idx) {
    *true_pos = 0;
    *false_neg = 0;
    if (start_idx < end_idx) {
      pfVar3 = (pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar4 = (Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        fVar1 = pfVar3[start_idx];
        fVar2 = pfVar4[start_idx];
        if (((0.0 < fVar1) && (piVar6 = true_pos, 0.0 < fVar2)) ||
           ((fVar1 <= 0.0 && (piVar6 = false_neg, 0.0 < fVar2)))) {
          *piVar6 = *piVar6 + 1;
        }
        start_idx = start_idx + 1;
      } while (end_idx != start_idx);
    }
    return;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_6c.severity_ = ERR;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
             ,"");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"recall_accum_thread","");
  poVar5 = Logger::Start(ERR,&local_48,0x128,&local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"CHECK_GE failed ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
             ,0x5b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x128);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"end_idx",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"start_idx",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  Logger::~Logger(&local_6c);
  abort();
}

Assistant:

static void recall_accum_thread(const std::vector<real_t>* Y,
                                const std::vector<real_t>* pred,
                                index_t* true_pos,
                                index_t* false_neg,
                                size_t start_idx,
                                size_t end_idx) {
    CHECK_GE(end_idx, start_idx);
    *true_pos = 0;
    *false_neg = 0;
    for (size_t i = start_idx; i < end_idx; ++i) {
      real_t p_label = (*pred)[i] > 0 ? 1 : -1;
      real_t r_label = (*Y)[i] > 0 ? 1 : -1;
      if (p_label > 0 && r_label > 0) {
        (*true_pos)++;
      } else if (p_label < 0 && r_label > 0) {
        (*false_neg)++;
      }
    }
  }